

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O1

int __thiscall Match::play(Match *this,int numGames)

{
  pointer *ppMVar1;
  pointer *ppMVar2;
  pointer pcVar3;
  Move MVar4;
  Move MVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  uint uVar10;
  int iVar11;
  vector<Move,_std::allocator<Move>_> moveHistory2;
  vector<Move,_std::allocator<Move>_> moveHistory1;
  Move local_80;
  vector<Move,_std::allocator<Move>_> local_78;
  vector<Move,_std::allocator<Move>_> local_58;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Playing match between ",0x16);
  ppMVar1 = &local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pcVar3 = (this->m_p1->m_name)._M_dataplus._M_p;
  local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppMVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->m_p1->m_name)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                              super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," and ",5);
  ppMVar2 = &local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pcVar3 = (this->m_p2->m_name)._M_dataplus._M_p;
  local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppMVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (this->m_p2->m_name)._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_78.super__Vector_base<Move,_std::allocator<Move>_>.
                                     _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_finish);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if (local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppMVar2) {
    operator_delete(local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppMVar1) {
    operator_delete(local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar11 = 0;
  local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Move *)0x0;
  local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish
       = (Move *)0x0;
  local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Move *)0x0;
  local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish
       = (Move *)0x0;
  if (0 < numGames) {
    iVar11 = 0;
    do {
      iVar6 = (*this->m_p1->_vptr_Player[2])(this->m_p1,&local_58);
      iVar7 = (*this->m_p2->_vptr_Player[2])(this->m_p2,&local_78);
      uVar8 = ((iVar6 - iVar7) + 3U) % 3;
      uVar10 = (uint)(uVar8 == 1);
      if (uVar8 == 2) {
        uVar10 = 0xffffffff;
      }
      if (local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        local_80.m_me = iVar6;
        local_80.m_you = iVar7;
        std::vector<Move,_std::allocator<Move>_>::_M_realloc_insert<Move>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_80);
      }
      else {
        MVar4.m_you = iVar7;
        MVar4.m_me = iVar6;
        *local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
         _M_finish = MVar4;
        local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_80.m_me = iVar7;
      local_80.m_you = iVar6;
      if (local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Move,_std::allocator<Move>_>::_M_realloc_insert<Move>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_80);
      }
      else {
        MVar5.m_you = iVar6;
        MVar5.m_me = iVar7;
        *local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
         _M_finish = MVar5;
        local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar11 = iVar11 + uVar10;
      numGames = numGames + -1;
    } while (numGames != 0);
  }
  if (local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar11;
}

Assistant:

int Match::play(int numGames)
{
   std::cout << "Playing match between " << m_p1->name() << " and "
      << m_p2->name() << std::endl;

   // The two variables below contain the same information, but in two different orders.
   std::vector<Move> moveHistory1;  // History of moves so far, seen from p1's perspective.
   std::vector<Move> moveHistory2;  // History of moves so far, seen from p2's perspective.

   int sum = 0;
   for (int g=0; g<numGames; ++g)
   {
      unsigned int draw1 = m_p1->move(moveHistory1);
      unsigned int draw2 = m_p2->move(moveHistory2);

      assert (draw1 < 3);
      assert (draw2 < 3);

      int res = 0;
      switch ((draw1-draw2+3) % 3)
      {
         case 0 : break;    // draw
         case 1 : res = 1;  // P1 wins
                  break;
         case 2 : res = -1; // P1 loses
                  break;
      }

#ifdef DEBUG
      std::cout << "Game " << g << ": " << names[draw1] << " v " << names[draw2] << " : " << res << std::endl; 
#endif

      moveHistory1.push_back(Move(draw1, draw2));
      moveHistory2.push_back(Move(draw2, draw1));

      sum += res;
   } // end of for

   return sum;
}